

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
PlatformIdNode::Evaluate
          (string *__return_storage_ptr__,PlatformIdNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *param_3,
          cmGeneratorExpressionDAGChecker *param_4)

{
  cmMakefile *this_00;
  pointer pbVar1;
  int iVar2;
  char *__s2;
  char *pcVar3;
  allocator local_41;
  string local_40;
  
  this_00 = context->LG->Makefile;
  std::__cxx11::string::string((string *)&local_40,"CMAKE_SYSTEM_NAME",&local_41);
  __s2 = cmMakefile::GetSafeDefinition(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pbVar1 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar1 == (parameters->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    pcVar3 = "";
    if (__s2 != (char *)0x0) {
      pcVar3 = __s2;
    }
  }
  else if (__s2 == (char *)0x0) {
    pcVar3 = "0";
    if (pbVar1->_M_string_length == 0) {
      pcVar3 = "1";
    }
  }
  else {
    iVar2 = strcmp((pbVar1->_M_dataplus)._M_p,__s2);
    if (iVar2 == 0) {
      pcVar3 = "1";
    }
    else {
      pcVar3 = "0";
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,(allocator *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string>& parameters,
                       cmGeneratorExpressionContext* context,
                       const GeneratorExpressionContent* /*content*/,
                       cmGeneratorExpressionDAGChecker* /*dagChecker*/) const
    CM_OVERRIDE
  {
    const char* platformId =
      context->LG->GetMakefile()->GetSafeDefinition("CMAKE_SYSTEM_NAME");
    if (parameters.empty()) {
      return platformId ? platformId : "";
    }

    if (!platformId) {
      return parameters.front().empty() ? "1" : "0";
    }

    if (strcmp(parameters.begin()->c_str(), platformId) == 0) {
      return "1";
    }
    return "0";
  }